

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

void __thiscall
glcts::ArraysOfArrays::InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  _Base_ptr *__rhs;
  iterator iVar1;
  TestError *this_00;
  long lVar2;
  string function_use;
  string function_definition;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  long local_118;
  string verification;
  string iterator_declaration;
  string iteration_loop_start;
  string iteration_loop_end;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&iteration_loop_end,
             "                               }\n                           }\n                        }\n                    }\n                }\n            }\n        }\n    }\n"
             ,(allocator<char> *)&iteration_loop_start);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&iteration_loop_start,
             "    for (uint a = 0u; a < 2u; a++)\n    {\n        for (uint b = 0u; b < 2u; b++)\n        {\n            for (uint c = 0u; c < 2u; c++)\n            {\n                for (uint d = 0u; d < 2u; d++)\n                {\n                    for (uint e = 0u; e < 2u; e++)\n                    {\n                        for (uint f = 0u; f < 2u; f++)\n                        {\n                           for (uint g = 0u; g < 2u; g++)\n                           {\n                               for (uint h = 0u; h < 2u; h++)\n                               {\n"
             ,(allocator<char> *)&iterator_declaration);
  lVar2 = 0;
  while( true ) {
    if (lVar2 == 0x3c) {
      std::__cxx11::string::~string((string *)&iteration_loop_start);
      std::__cxx11::string::~string((string *)&iteration_loop_end);
      return;
    }
    local_118 = lVar2;
    iVar1 = std::
            _Rb_tree<glcts::test_var_type,_std::pair<const_glcts::test_var_type,_glcts::var_descriptor>,_std::_Select1st<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
            ::find((_Rb_tree<glcts::test_var_type,_std::pair<const_glcts::test_var_type,_glcts::var_descriptor>,_std::_Select1st<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                    *)supported_variable_types_map,
                   (key_type *)((long)test_shader_compilation::var_types_set_gl + lVar2));
    if (iVar1._M_node == (_Base_ptr)(supported_variable_types_map + 8)) break;
    __rhs = &iVar1._M_node[6]._M_parent;
    std::operator+(&verification,"    ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
    std::operator+(&function_use,&verification," iterator = ");
    std::operator+(&function_definition,&function_use,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &iVar1._M_node[5]._M_parent);
    std::operator+(&iterator_declaration,&function_definition,";\n");
    std::__cxx11::string::~string((string *)&function_definition);
    std::__cxx11::string::~string((string *)&function_use);
    std::__cxx11::string::~string((string *)&verification);
    function_definition._M_dataplus._M_p = (pointer)&function_definition.field_2;
    function_definition._M_string_length = 0;
    function_use._M_dataplus._M_p = (pointer)&function_use.field_2;
    function_use._M_string_length = 0;
    function_definition.field_2._M_local_buf[0] = '\0';
    function_use.field_2._M_local_buf[0] = '\0';
    verification._M_dataplus._M_p = (pointer)&verification.field_2;
    verification._M_string_length = 0;
    verification.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::assign((char *)&function_definition);
    std::__cxx11::string::append((string *)&function_definition);
    std::__cxx11::string::append((char *)&function_definition);
    std::__cxx11::string::append((string *)&function_definition);
    std::__cxx11::string::append((string *)&function_definition);
    std::operator+(&local_138,
                   "                                   output_array[a][b][c][d][e][f][g][h] = ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &iVar1._M_node[8]._M_parent);
    std::operator+(&local_90,&local_138,";\n");
    std::__cxx11::string::append((string *)&function_definition);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_138);
    std::operator+(&local_138,"                                   iterator += ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
    std::operator+(&local_90,&local_138,"(1);\n");
    std::__cxx11::string::append((string *)&function_definition);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::append((string *)&function_definition);
    std::__cxx11::string::append((char *)&function_definition);
    std::operator+(&local_138,"    ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &iVar1._M_node[1]._M_parent);
    std::operator+(&local_90,&local_138," my_array[2][2][2][2][2][2][2][2];\n");
    std::__cxx11::string::operator=((string *)&function_use,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::append((char *)&function_use);
    std::__cxx11::string::_M_assign((string *)&verification);
    std::__cxx11::string::append((char *)&verification);
    std::__cxx11::string::append((string *)&verification);
    std::operator+(&local_70,
                   "                                   if (my_array[a][b][c][d][e][f][g][h] ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &iVar1._M_node[7]._M_parent);
    std::operator+(&local_50,&local_70,
                   " != iterator)\n                                   {\n                                       result = 0.0;\n                                   }\n                                   iterator += "
                  );
    std::operator+(&local_138,&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
    std::operator+(&local_90,&local_138,"(1);\n");
    std::__cxx11::string::append((string *)&verification);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::append((string *)&verification);
    if (tested_shader_type == COMPUTE_SHADER_TYPE) {
      execute_dispatch_test
                (this,COMPUTE_SHADER_TYPE,&function_definition,&function_use,&verification);
    }
    else {
      execute_draw_test(this,tested_shader_type,&function_definition,&function_use,&verification);
    }
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[5])();
    std::__cxx11::string::~string((string *)&verification);
    std::__cxx11::string::~string((string *)&function_use);
    std::__cxx11::string::~string((string *)&function_definition);
    std::__cxx11::string::~string((string *)&iterator_declaration);
    lVar2 = local_118 + 4;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Type not found.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0x11cf);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void InteractionFunctionCalls1<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	static const glcts::test_var_type var_types_set_es[] = { VAR_TYPE_INT,   VAR_TYPE_FLOAT, VAR_TYPE_IVEC2,
															 VAR_TYPE_IVEC3, VAR_TYPE_IVEC4, VAR_TYPE_VEC2,
															 VAR_TYPE_VEC3,  VAR_TYPE_VEC4,  VAR_TYPE_MAT2,
															 VAR_TYPE_MAT3,  VAR_TYPE_MAT4 };
	static const size_t num_var_types_es = sizeof(var_types_set_es) / sizeof(var_types_set_es[0]);

	static const glcts::test_var_type var_types_set_gl[] = { VAR_TYPE_INT,   VAR_TYPE_FLOAT, VAR_TYPE_IVEC2,
															 VAR_TYPE_IVEC3, VAR_TYPE_IVEC4, VAR_TYPE_VEC2,
															 VAR_TYPE_VEC3,  VAR_TYPE_VEC4,  VAR_TYPE_MAT2,
															 VAR_TYPE_MAT3,  VAR_TYPE_MAT4,  VAR_TYPE_DOUBLE,
															 VAR_TYPE_DMAT2, VAR_TYPE_DMAT3, VAR_TYPE_DMAT4 };
	static const size_t num_var_types_gl = sizeof(var_types_set_gl) / sizeof(var_types_set_gl[0]);

	const std::string iteration_loop_end = "                               }\n"
										   "                           }\n"
										   "                        }\n"
										   "                    }\n"
										   "                }\n"
										   "            }\n"
										   "        }\n"
										   "    }\n";
	const std::string iteration_loop_start = "    for (uint a = 0u; a < 2u; a++)\n"
											 "    {\n"
											 "        for (uint b = 0u; b < 2u; b++)\n"
											 "        {\n"
											 "            for (uint c = 0u; c < 2u; c++)\n"
											 "            {\n"
											 "                for (uint d = 0u; d < 2u; d++)\n"
											 "                {\n"
											 "                    for (uint e = 0u; e < 2u; e++)\n"
											 "                    {\n"
											 "                        for (uint f = 0u; f < 2u; f++)\n"
											 "                        {\n"
											 "                           for (uint g = 0u; g < 2u; g++)\n"
											 "                           {\n"
											 "                               for (uint h = 0u; h < 2u; h++)\n"
											 "                               {\n";
	const glcts::test_var_type* var_types_set = var_types_set_es;
	size_t						num_var_types = num_var_types_es;
	const bool					test_compute  = (TestCaseBase<API>::COMPUTE_SHADER_TYPE == tested_shader_type);

	if (API::USE_DOUBLE)
	{
		var_types_set = var_types_set_gl;
		num_var_types = num_var_types_gl;
	}

	for (size_t var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(var_types_set[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			std::string iterator_declaration = "    " + var_iterator->second.iterator_type +
											   " iterator = " + var_iterator->second.iterator_initialization + ";\n";

			std::string function_definition;
			std::string function_use;
			std::string verification;

			function_definition = "void my_function(out ";
			function_definition += var_iterator->second.type;
			function_definition += " output_array[2][2][2][2][2][2][2][2]) {\n";
			function_definition += iterator_declaration;
			function_definition += iteration_loop_start;
			function_definition += "                                   output_array[a][b][c][d][e][f][g][h] = " +
								   var_iterator->second.variable_type_initializer1 + ";\n";
			function_definition +=
				"                                   iterator += " + var_iterator->second.iterator_type + "(1);\n";
			function_definition += iteration_loop_end;
			function_definition += "}";

			function_use = "    " + var_iterator->second.type + " my_array[2][2][2][2][2][2][2][2];\n";
			function_use += "    my_function(my_array);";

			verification = iterator_declaration;
			verification += "    float result = 1.0;\n";
			verification += iteration_loop_start;
			verification += "                                   if (my_array[a][b][c][d][e][f][g][h] " +
							var_iterator->second.specific_element +
							" != iterator)\n"
							"                                   {\n"
							"                                       result = 0.0;\n"
							"                                   }\n"
							"                                   iterator += " +
							var_iterator->second.iterator_type + "(1);\n";
			verification += iteration_loop_end;

			if (false == test_compute)
			{
				execute_draw_test(tested_shader_type, function_definition, function_use, verification);
			}
			else
			{
				execute_dispatch_test(tested_shader_type, function_definition, function_use, verification);
			}

			/* Deallocate any resources used. */
			this->delete_objects();
		} /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */
}